

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O3

DecoratorDataHandle __thiscall
Rml::DecoratorNinePatch::GenerateElementData
          (DecoratorNinePatch *this,Element *element,BoxArea paint_area)

{
  Colourb CVar1;
  undefined4 uVar2;
  int iVar3;
  array<Rml::NumericValue,_4UL> *paVar4;
  Element *this_00;
  bool bVar5;
  bool bVar6;
  int y;
  ComputedValues *pCVar7;
  int *piVar8;
  RenderManager *this_01;
  RenderManager *mesh_00;
  Vector2f *pVVar9;
  long lVar10;
  long lVar11;
  Vector2Type *pVVar12;
  long lVar13;
  int x;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined1 auVar18 [16];
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  Vector2f surface_dimensions;
  Mesh mesh;
  Vector2f tex_pos [4];
  Vector2f tex_coords [4];
  Texture texture;
  RenderBox render_box;
  float local_1a8 [2];
  undefined8 uStack_1a0;
  undefined8 local_198;
  float fStack_190;
  float fStack_18c;
  Vector2f local_188;
  undefined8 uStack_180;
  Vector2Type local_178;
  undefined8 uStack_170;
  Vector2Type local_168;
  undefined8 uStack_160;
  Element *local_150;
  Vector2i local_148;
  undefined8 uStack_140;
  Vector2Type local_138;
  undefined8 uStack_130;
  Vector2f local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  undefined1 auStack_100 [16];
  long lStack_f0;
  Vector2Type local_e8;
  Vector2Type local_e0;
  Vector2Type local_d8;
  Vector2Type local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Vector2Type local_a8;
  undefined8 uStack_a0;
  float local_98 [4];
  float local_88;
  float afStack_80 [4];
  Texture local_70;
  RenderBox local_60;
  
  pCVar7 = Element::GetComputedValues(element);
  lVar10 = 0;
  local_70 = Decorator::GetTexture(&this->super_Decorator,0);
  local_148 = Texture::GetDimensions(&local_70);
  uStack_140 = 0;
  local_150 = element;
  Element::GetRenderBox(&local_60,element,paint_area,0);
  this_00 = local_150;
  local_88 = local_60.border_widths._M_elems[3];
  afStack_80[0] = local_60.border_radius._M_elems[1];
  afStack_80[1] = local_60.border_radius._M_elems[2];
  local_98[0] = local_60.border_widths._M_elems[0];
  local_98[1] = local_60.border_widths._M_elems[1];
  local_188 = local_60.fill_size;
  uStack_180 = 0;
  local_120 = local_60.fill_size;
  CVar1 = (pCVar7->rare).image_color;
  fVar15 = (float)((uint)CVar1 >> 0x18) * (pCVar7->inherited).opacity;
  fVar16 = fVar15 / 255.0;
  local_a8 = (this->rect_outer).p0;
  uStack_a0 = 0;
  local_e8 = local_a8;
  local_138 = (this->rect_inner).p0;
  uStack_130 = 0;
  local_e0 = local_138;
  local_178 = (this->rect_inner).p1;
  uStack_170 = 0;
  local_d8 = local_178;
  local_168 = (this->rect_outer).p1;
  uStack_160 = 0;
  local_d0 = local_168;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  auVar18._0_4_ = (float)local_148.x;
  auVar18._4_4_ = (float)local_148.y;
  auVar18._8_4_ = (float)(int)uStack_140;
  auVar18._12_4_ = (float)uStack_140._4_4_;
  do {
    auVar19._8_8_ = 0;
    auVar19._0_4_ = (&local_e8)[lVar10].x;
    auVar19._4_4_ = (&local_e8)[lVar10].y;
    auVar19 = divps(auVar19,auVar18);
    (&local_c8)[lVar10] = auVar19._0_8_;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  fVar17 = ElementUtilities::GetDensityIndependentPixelRatio(local_150);
  fVar17 = fVar17 * this->display_scale;
  fVar20 = (local_138.x - local_a8.x) * fVar17;
  fVar21 = (local_138.y - local_a8.y) * fVar17;
  local_1a8[0] = 0.0;
  local_1a8[1] = 0.0;
  uStack_1a0 = CONCAT44(fVar21,fVar20);
  fVar22 = local_188.x - (local_168.x - local_178.x) * fVar17;
  fVar23 = local_188.y - (local_168.y - local_178.y) * fVar17;
  local_198 = CONCAT44(fVar23,fVar22);
  fStack_190 = local_188.x;
  fStack_18c = local_188.y;
  paVar4 = (this->edges)._M_t.
           super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
           .super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>._M_head_impl;
  if (paVar4 != (array<Rml::NumericValue,_4UL> *)0x0) {
    local_138.y = fVar21;
    local_138.x = fVar20;
    uStack_130 = CONCAT44((uStack_130._4_4_ - uStack_a0._4_4_) * fVar17,
                          ((float)uStack_130 - (float)uStack_a0) * fVar17);
    local_168.x = fVar22;
    local_168.y = fVar23;
    uStack_160._0_4_ = (float)uStack_180 - ((float)uStack_160 - (float)uStack_170) * fVar17;
    uStack_160._4_4_ = uStack_180._4_4_ - (uStack_160._4_4_ - uStack_170._4_4_) * fVar17;
    fVar21 = Element::ResolveNumericValue(this_00,paVar4->_M_elems[0],fVar21);
    local_148.x = (int)fVar21;
    local_178.x = local_188.x - local_168.x;
    local_178.y = local_188.y - local_168.y;
    uStack_170 = CONCAT44(uStack_180._4_4_ - uStack_160._4_4_,(float)uStack_180 - (float)uStack_160)
    ;
    local_168.x = Element::ResolveNumericValue
                            (this_00,((this->edges)._M_t.
                                      super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                      .
                                      super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>
                                     ._M_head_impl)->_M_elems[1],local_178.x);
    local_168.y = extraout_XMM0_Db;
    uStack_160 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
    local_178.x = Element::ResolveNumericValue
                            (this_00,((this->edges)._M_t.
                                      super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                      .
                                      super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>
                                     ._M_head_impl)->_M_elems[2],local_178.y);
    local_178.y = extraout_XMM0_Db_00;
    uStack_170 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
    fVar20 = Element::ResolveNumericValue
                       (this_00,((this->edges)._M_t.
                                 super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                 .super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>
                                ._M_head_impl)->_M_elems[3],local_138.x);
    fVar21 = (float)local_148.x;
    fVar22 = local_188.x - local_168.x;
    fVar23 = local_188.y - local_178.x;
    local_198 = CONCAT44(fVar23,fVar22);
    uStack_1a0 = CONCAT44(fVar21,fVar20);
  }
  lVar10 = 0;
  pVVar9 = &local_120;
  pVVar12 = &local_e8;
  fVar17 = fVar22 - fVar20;
  bVar5 = true;
  do {
    bVar6 = bVar5;
    if (fVar17 < 0.0) {
      fVar17 = (&local_e0.x)[lVar10] - pVVar12->x;
      fVar17 = (fVar17 / (((&local_d0.x)[lVar10] - (&local_d8.x)[lVar10]) + fVar17)) * pVVar9->x;
      *(float *)((long)&uStack_1a0 + lVar10 * 4) = fVar17;
      *(float *)((long)&local_198 + lVar10 * 4) = fVar17;
    }
    lVar10 = 1;
    pVVar9 = (Vector2f *)&local_120.y;
    pVVar12 = (Vector2Type *)&local_e8.y;
    fVar17 = fVar23 - fVar21;
    bVar5 = false;
  } while (bVar6);
  lVar10 = 0;
  do {
    fVar21 = local_1a8[lVar10 * 2 + 1];
    fVar17 = *(float *)(&uStack_1a0 + lVar10);
    fVar20 = *(float *)((long)&uStack_1a0 + lVar10 * 8 + 4);
    local_1a8[lVar10 * 2] = local_1a8[lVar10 * 2] + local_88;
    local_1a8[lVar10 * 2 + 1] = fVar21 + local_98[0];
    *(float *)(&uStack_1a0 + lVar10) = fVar17 + local_88;
    *(float *)((long)&uStack_1a0 + lVar10 * 8 + 4) = fVar20 + local_98[0];
    lVar10 = lVar10 + 2;
  } while (lVar10 != 4);
  local_188.x = Math::Round((float)uStack_1a0);
  local_188.y = (float)extraout_XMM0_Db_01;
  fVar21 = Math::Round(uStack_1a0._4_4_);
  uStack_1a0 = CONCAT44(fVar21,local_188.x);
  local_188.x = Math::Round((float)local_198);
  local_188.y = (float)extraout_XMM0_Db_02;
  fVar21 = Math::Round(local_198._4_4_);
  local_198 = CONCAT44(fVar21,local_188.x);
  stack0xffffffffffffff08 = (undefined1  [16])0x0;
  _local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  lVar11 = 0x10;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize
            ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)local_118,0x10);
  lVar10 = 0;
  do {
    fVar21 = local_1a8[lVar10 * 2 + 1];
    uVar2 = *(undefined4 *)((long)&local_c8 + lVar10 * 8 + 4);
    lVar14 = 0;
    lVar13 = lVar11;
    do {
      *(uint *)(local_118._0_8_ + lVar13 + -8) =
           (int)fVar15 << 0x18 |
           ((int)((float)((uint)CVar1 >> 0x10 & 0xff) * fVar16) & 0xffU) << 0x10 |
           ((int)((float)((uint)CVar1 >> 8 & 0xff) * fVar16) & 0xffU) << 8 |
           (int)((float)((uint)CVar1 & 0xff) * fVar16) & 0xffU;
      *(float *)(local_118._0_8_ + lVar13 + -0x10) = local_1a8[lVar14 * 2];
      *(float *)(local_118._0_8_ + lVar13 + -0xc) = fVar21;
      *(undefined4 *)(local_118._0_8_ + lVar13 + -4) = *(undefined4 *)(&local_c8 + lVar14);
      *(undefined4 *)((long)&((Vector2f *)local_118._0_8_)->x + lVar13) = uVar2;
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0x14;
    } while (lVar14 != 4);
    lVar10 = lVar10 + 1;
    lVar11 = lVar11 + 0x50;
  } while (lVar10 != 4);
  ::std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)(local_108 + 8),0x36);
  lVar10 = 0;
  piVar8 = (int *)auStack_100._0_8_;
  do {
    iVar3 = *(int *)((long)&DAT_002d2630 + lVar10);
    *piVar8 = iVar3;
    piVar8[1] = iVar3 + 4;
    piVar8[2] = iVar3 + 1;
    piVar8[3] = iVar3 + 1;
    piVar8[4] = iVar3 + 4;
    piVar8[5] = iVar3 + 5;
    piVar8 = piVar8 + 6;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x24);
  this_01 = (RenderManager *)operator_new(0x10);
  mesh_00 = Element::GetRenderManager(local_150);
  RenderManager::MakeGeometry(this_01,(Mesh *)mesh_00);
  if ((void *)auStack_100._0_8_ != (void *)0x0) {
    operator_delete((void *)auStack_100._0_8_,lStack_f0 - auStack_100._0_8_);
  }
  if ((pointer)local_118._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_118._0_8_,(long)local_108 - local_118._0_8_);
  }
  return (DecoratorDataHandle)this_01;
}

Assistant:

DecoratorDataHandle DecoratorNinePatch::GenerateElementData(Element* element, BoxArea paint_area) const
{
	const auto& computed = element->GetComputedValues();

	Texture texture = GetTexture();
	const Vector2f texture_dimensions(texture.GetDimensions());

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f surface_offset = render_box.GetFillOffset();
	const Vector2f surface_dimensions = render_box.GetFillSize();

	const ColourbPremultiplied quad_colour = computed.image_color().ToPremultiplied(computed.opacity());

	/* In the following, we operate on the four diagonal vertices in the grid, as they define the whole grid. */

	// Absolute texture coordinates 'px'
	Vector2f tex_pos[4] = {
		rect_outer.TopLeft(),
		rect_inner.TopLeft(),
		rect_inner.BottomRight(),
		rect_outer.BottomRight(),
	};

	// Normalized texture coordinates [0, 1]
	Vector2f tex_coords[4];
	for (int i = 0; i < 4; i++)
		tex_coords[i] = tex_pos[i] / texture_dimensions;

	// Natural size is determined from the raw pixel size multiplied by the dp-ratio and the sprite's
	// display scale (determined by eg. the inverse of spritesheet's 'src-scale').
	const float scale_raw_to_natural_dimensions = ElementUtilities::GetDensityIndependentPixelRatio(element) * display_scale;

	// Surface position in pixels [0, surface_dimensions]
	// Need to keep the corner patches at their natural size, but stretch the inner patches.
	Vector2f surface_pos[4];
	surface_pos[0] = {0, 0};
	surface_pos[1] = (tex_pos[1] - tex_pos[0]) * scale_raw_to_natural_dimensions;
	surface_pos[2] = surface_dimensions - (tex_pos[3] - tex_pos[2]) * scale_raw_to_natural_dimensions;
	surface_pos[3] = surface_dimensions;

	// Change the size of the edges if specified.
	if (edges)
	{
		float lengths[4]; // top, right, bottom, left
		lengths[0] = element->ResolveNumericValue((*edges)[0], (surface_pos[1].y - surface_pos[0].y));
		lengths[1] = element->ResolveNumericValue((*edges)[1], (surface_pos[3].x - surface_pos[2].x));
		lengths[2] = element->ResolveNumericValue((*edges)[2], (surface_pos[3].y - surface_pos[2].y));
		lengths[3] = element->ResolveNumericValue((*edges)[3], (surface_pos[1].x - surface_pos[0].x));

		surface_pos[1].y = lengths[0];
		surface_pos[2].x = surface_dimensions.x - lengths[1];
		surface_pos[2].y = surface_dimensions.y - lengths[2];
		surface_pos[1].x = lengths[3];
	}

	// In case the surface dimensions are less than the size of the corners, we need to scale down the corner rectangles, one dimension at a time.
	const Vector2f surface_center_size = surface_pos[2] - surface_pos[1];
	for (int i = 0; i < 2; i++)
	{
		if (surface_center_size[i] < 0.0f)
		{
			float top_left_size = tex_pos[1][i] - tex_pos[0][i];
			float bottom_right_size = tex_pos[3][i] - tex_pos[2][i];
			surface_pos[1][i] = top_left_size / (top_left_size + bottom_right_size) * surface_dimensions[i];
			surface_pos[2][i] = surface_pos[1][i];
		}
	}

	// Now offset all positions, relative to the border box.
	for (Vector2f& surface_pos_entry : surface_pos)
		surface_pos_entry += surface_offset;

	// Round the inner corners
	surface_pos[1] = surface_pos[1].Round();
	surface_pos[2] = surface_pos[2].Round();

	/* Now we have all the coordinates we need. Expand the diagonal vertices to the 16 individual vertices. */
	Mesh mesh;
	Vector<Vertex>& vertices = mesh.vertices;
	Vector<int>& indices = mesh.indices;

	vertices.resize(4 * 4);

	for (int y = 0; y < 4; y++)
	{
		for (int x = 0; x < 4; x++)
		{
			Vertex& vertex = vertices[y * 4 + x];
			vertex.colour = quad_colour;
			vertex.position = {surface_pos[x].x, surface_pos[y].y};
			vertex.tex_coord = {tex_coords[x].x, tex_coords[y].y};
		}
	}

	// Nine rectangles, two triangles per rectangle, three indices per triangle.
	indices.resize(9 * 2 * 3);

	// Fill in the indices one rectangle at a time.
	const int top_left_indices[9] = {0, 1, 2, 4, 5, 6, 8, 9, 10};
	for (int rectangle = 0; rectangle < 9; rectangle++)
	{
		int i = rectangle * 6;
		int top_left_index = top_left_indices[rectangle];
		indices[i] = top_left_index;
		indices[i + 1] = top_left_index + 4;
		indices[i + 2] = top_left_index + 1;
		indices[i + 3] = top_left_index + 1;
		indices[i + 4] = top_left_index + 4;
		indices[i + 5] = top_left_index + 5;
	}

	Geometry* data = new Geometry(element->GetRenderManager()->MakeGeometry(std::move(mesh)));

	return reinterpret_cast<DecoratorDataHandle>(data);
}